

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tag_scalar_vector.hpp
# Opt level: O0

void __thiscall
cfgfile::
tag_scalar_vector_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfgfile::string_trait_t>
::on_string(tag_scalar_vector_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfgfile::string_trait_t>
            *this,parser_info_t<cfgfile::string_trait_t> *info,string_t *str)

{
  bool bVar1;
  byte bVar2;
  undefined8 uVar3;
  parser_info_t<cfgfile::string_trait_t> *in_RSI;
  tag_t<cfgfile::string_trait_t> *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> value;
  string *in_stack_fffffffffffffa38;
  allocator *paVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa40;
  parser_info_t<cfgfile::string_trait_t> *in_stack_fffffffffffffa48;
  allocator *paVar5;
  tag_t<cfgfile::string_trait_t> *in_stack_fffffffffffffa50;
  exception_t<cfgfile::string_trait_t> *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa78;
  allocator local_551;
  string local_550 [103];
  allocator local_4e9;
  string local_4e8 [71];
  allocator local_4a1;
  string local_4a0 [71];
  undefined1 local_459 [72];
  allocator local_411;
  string local_410 [320];
  string local_2d0 [38];
  undefined1 local_2aa;
  allocator local_2a9;
  string local_2a8 [103];
  allocator local_241;
  string local_240 [71];
  allocator local_1f9;
  string local_1f8 [71];
  allocator local_1b1;
  string local_1b0 [87];
  allocator local_159;
  string local_158 [328];
  parser_info_t<cfgfile::string_trait_t> *local_10;
  
  local_10 = in_RSI;
  bVar1 = tag_t<cfgfile::string_trait_t>::is_any_child_defined(in_stack_fffffffffffffa50);
  if (bVar1) {
    local_2aa = 1;
    uVar3 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_158,"Value \"",&local_159);
    string_trait_t::from_ascii(in_stack_fffffffffffffa38);
    std::operator+(&in_stack_fffffffffffffa48->m_file_name,in_stack_fffffffffffffa40);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1b0,"\" for tag \"",&local_1b1);
    string_trait_t::from_ascii(in_stack_fffffffffffffa38);
    std::operator+(in_stack_fffffffffffffa78,in_stack_fffffffffffffa70);
    tag_t<cfgfile::string_trait_t>::name_abi_cxx11_(in_RDI);
    std::operator+(&in_stack_fffffffffffffa48->m_file_name,in_stack_fffffffffffffa40);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_1f8,"\" must be defined before any child tag. In file \"",&local_1f9);
    string_trait_t::from_ascii(in_stack_fffffffffffffa38);
    std::operator+(in_stack_fffffffffffffa78,in_stack_fffffffffffffa70);
    parser_info_t<cfgfile::string_trait_t>::file_name_abi_cxx11_(local_10);
    std::operator+(&in_stack_fffffffffffffa48->m_file_name,in_stack_fffffffffffffa40);
    paVar4 = &local_241;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_240,"\" on line ",paVar4);
    string_trait_t::from_ascii(in_stack_fffffffffffffa38);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)paVar4,
                   in_stack_fffffffffffffa70);
    parser_info_t<cfgfile::string_trait_t>::line_number(local_10);
    string_trait_t::to_string_abi_cxx11_((pos_t)in_stack_fffffffffffffa38);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)paVar4,
                   in_stack_fffffffffffffa70);
    paVar5 = &local_2a9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2a8,".",paVar5);
    string_trait_t::from_ascii(in_stack_fffffffffffffa38);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)paVar4,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)paVar5);
    exception_t<cfgfile::string_trait_t>::exception_t
              ((exception_t<cfgfile::string_trait_t> *)in_stack_fffffffffffffa50,
               &in_stack_fffffffffffffa48->m_file_name);
    local_2aa = 0;
    __cxa_throw(uVar3,&exception_t<cfgfile::string_trait_t>::typeinfo,
                exception_t<cfgfile::string_trait_t>::~exception_t);
  }
  format_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfgfile::string_trait_t>
  ::from_string(in_stack_fffffffffffffa48,in_stack_fffffffffffffa40);
  if ((*(long *)&in_RDI[1].field_0x18 != 0) &&
     (bVar2 = (**(code **)(**(long **)&in_RDI[1].field_0x18 + 0x10))
                        (*(long **)&in_RDI[1].field_0x18,local_2d0), (bVar2 & 1) == 0)) {
    uVar3 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_410,"Invalid value: \"",&local_411);
    string_trait_t::from_ascii(in_stack_fffffffffffffa38);
    std::operator+(&in_stack_fffffffffffffa48->m_file_name,in_stack_fffffffffffffa40);
    this_00 = (exception_t<cfgfile::string_trait_t> *)local_459;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_459 + 1),"\". Value must match to the constraint in tag \"",
               (allocator *)this_00);
    string_trait_t::from_ascii(in_stack_fffffffffffffa38);
    std::operator+(in_stack_fffffffffffffa78,in_stack_fffffffffffffa70);
    tag_t<cfgfile::string_trait_t>::name_abi_cxx11_(in_RDI);
    std::operator+(&in_stack_fffffffffffffa48->m_file_name,in_stack_fffffffffffffa40);
    paVar5 = &local_4a1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_4a0,"\". In file \"",paVar5);
    string_trait_t::from_ascii(in_stack_fffffffffffffa38);
    std::operator+(in_stack_fffffffffffffa78,in_stack_fffffffffffffa70);
    parser_info_t<cfgfile::string_trait_t>::file_name_abi_cxx11_(local_10);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)paVar5,
                   in_stack_fffffffffffffa40);
    paVar4 = &local_4e9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_4e8,"\" on line ",paVar4);
    string_trait_t::from_ascii(in_stack_fffffffffffffa38);
    std::operator+(in_stack_fffffffffffffa78,in_stack_fffffffffffffa70);
    parser_info_t<cfgfile::string_trait_t>::line_number(local_10);
    string_trait_t::to_string_abi_cxx11_((pos_t)in_stack_fffffffffffffa38);
    std::operator+(in_stack_fffffffffffffa78,in_stack_fffffffffffffa70);
    paVar4 = &local_551;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_550,".",paVar4);
    string_trait_t::from_ascii((string *)paVar4);
    std::operator+(in_stack_fffffffffffffa78,in_stack_fffffffffffffa70);
    exception_t<cfgfile::string_trait_t>::exception_t(this_00,(string_t *)paVar5);
    __cxa_throw(uVar3,&exception_t<cfgfile::string_trait_t>::typeinfo,
                exception_t<cfgfile::string_trait_t>::~exception_t);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffffa50,&in_stack_fffffffffffffa48->m_file_name);
  tag_t<cfgfile::string_trait_t>::set_defined(in_RDI,true);
  std::__cxx11::string::~string(local_2d0);
  return;
}

Assistant:

void on_string( const parser_info_t< Trait > & info,
		const typename Trait::string_t & str ) override
	{
		if( this->is_any_child_defined() )
			throw exception_t< Trait >(
				Trait::from_ascii( "Value \"" ) + str +
				Trait::from_ascii( "\" for tag \"" ) + this->name() +
				Trait::from_ascii( "\" must be defined before any child "
					"tag. In file \"" ) +
				info.file_name() + Trait::from_ascii( "\" on line " ) +
				Trait::to_string( info.line_number() ) +
				Trait::from_ascii( "." ) );

		const T value = format_t< T, Trait >::from_string( info, str );

		if( m_constraint )
		{
			if( !m_constraint->check( value ) )
				throw exception_t< Trait >(
					Trait::from_ascii( "Invalid value: \"" ) +
					str + Trait::from_ascii( "\". Value must match to the "
						"constraint in tag \"" ) +
					this->name() + Trait::from_ascii( "\". In file \"" ) +
					info.file_name() + Trait::from_ascii( "\" on line " ) +
					Trait::to_string( info.line_number() ) +
					Trait::from_ascii( "." ) );
		}

		m_values.push_back( value );

		this->set_defined();
	}